

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_kneip_main
               (Matrix<double,_3,_5,_0,_3,_5> *f1,Matrix<double,_3,_5,_0,_3,_5> *f2,
               rotations_t *rotations)

{
  Scalar SVar1;
  Scalar SVar2;
  int iVar3;
  bool bVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  undefined8 uVar8;
  double dVar9;
  double dVar10;
  Scalar SVar11;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *this_01;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
  *other_00;
  ReturnType RVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int i_1;
  bool positive;
  Vector3d tempVector2;
  Vector3d tempVector1;
  Vector3d trans34;
  Vector3d trans24;
  Vector3d trans23;
  Vector3d trans14;
  Vector3d trans13;
  Vector3d trans12;
  Vector3d trans04;
  Vector3d trans03;
  Vector3d trans02;
  Vector3d trans01;
  Matrix<double,_3,_5,_0,_3,_5> normalVectors;
  double totalEval;
  Matrix3d eval;
  double tempNorm;
  complex<double> tempp;
  uint i;
  rotation_t finalRotation;
  Matrix<std::complex<double>,_20,_20,_0,_20,_20> V;
  Matrix<std::complex<double>,_20,_1,_0,_20,_1> D;
  EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> Eig;
  Matrix<double,_20,_20,_0,_20,_20> M;
  int thirdFeat;
  int secondFeat;
  int firstFeat;
  int currentRow;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  c_2;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  c_1;
  Matrix3d temp2;
  Matrix3d temp1;
  Matrix<double,_66,_197,_0,_66,_197> groebnerMatrix;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffdbf00;
  DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_> *in_stack_fffffffffffdbf08;
  MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>_>
  *in_stack_fffffffffffdbf10;
  DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_> *in_stack_fffffffffffdbf18;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_10,_20,_false>_>
  *in_stack_fffffffffffdbf20;
  DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_> *in_stack_fffffffffffdbf48;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffdbf50;
  undefined8 in_stack_fffffffffffdbf58;
  undefined1 computeEigenvectors;
  EigenBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> *in_stack_fffffffffffdbf60;
  EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> *in_stack_fffffffffffdbf68;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *other_01;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
  *in_stack_fffffffffffdbfc8;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
  *in_stack_fffffffffffdbfd0;
  EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> *in_stack_fffffffffffdc0a0;
  Scalar SVar97;
  int iStack_232c8;
  DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_> aDStack_232c0 [9208];
  double dStack_20ec8;
  RealScalar RStack_20cc8;
  double dStack_20cc0;
  double dStack_20cb8;
  double dStack_20cb0;
  double dStack_20ca8;
  double dStack_20ca0;
  double dStack_20c98;
  double dStack_20c90;
  double dStack_20c88;
  double dStack_20c80;
  double dStack_20c78;
  double dStack_20c70;
  double dStack_20c68;
  double dStack_20c60;
  double dStack_20c58;
  double dStack_20c50;
  undefined8 uStack_20c48;
  undefined8 uStack_20c40;
  double dStack_20c38;
  double dStack_20c30;
  double dStack_20c28;
  uint uStack_20c1c;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffdf998;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffdf9a0;
  EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> EStack_1f180;
  int iStack_199b4;
  int iStack_197cc;
  int iStack_197c8;
  int iStack_197c4;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  vStack_197c0;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  avStack_19798 [4347];
  
  Eigen::DenseBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>::Zero();
  Eigen::Matrix<double,66,197,0,66,197>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,66,197,0,66,197>>>
            ((Matrix<double,_66,_197,_0,_66,_197> *)in_stack_fffffffffffdbf08,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_66,_197,_0,_66,_197>_>_>
              *)in_stack_fffffffffffdbf00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,in_stack_fffffffffffdbf00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,in_stack_fffffffffffdbf00);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xcde412);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)in_stack_fffffffffffdbf18,(value_type *)in_stack_fffffffffffdbf10);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)in_stack_fffffffffffdbf18,(value_type *)in_stack_fffffffffffdbf10);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)in_stack_fffffffffffdbf18,(value_type *)in_stack_fffffffffffdbf10);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xcde464);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)in_stack_fffffffffffdbf18,(value_type *)in_stack_fffffffffffdbf10);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)in_stack_fffffffffffdbf18,(value_type *)in_stack_fffffffffffdbf10);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)in_stack_fffffffffffdbf18,(value_type *)in_stack_fffffffffffdbf10);
  iStack_197c4 = 0;
  for (iStack_197c8 = 0;
      computeEigenvectors = (undefined1)((ulong)in_stack_fffffffffffdbf58 >> 0x38),
      iVar3 = iStack_197c8, iStack_197c8 < 5; iStack_197c8 = iStack_197c8 + 1) {
    while (iStack_197cc = iVar3 + 1, iStack_197cc < 5) {
      Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
      Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>::
      transpose((DenseBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                in_stack_fffffffffffdbf08);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::operator*
                ((MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                  *)in_stack_fffffffffffdbf18,in_stack_fffffffffffdbf10);
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,
                 (DenseBase<Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>,_0>_>
                  *)in_stack_fffffffffffdbf00);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
      Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>::
      transpose((DenseBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                in_stack_fffffffffffdbf08);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::operator*
                ((MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                  *)in_stack_fffffffffffdbf18,in_stack_fffffffffffdbf10);
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,
                 (DenseBase<Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>,_0>_>
                  *)in_stack_fffffffffffdbf00);
      iStack_199b4 = iStack_197cc;
      while (iStack_199b4 = iStack_199b4 + 1, iVar3 = iStack_197cc, iStack_199b4 < 5) {
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0> *)
                   in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcde63c);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  (in_stack_fffffffffffdbf50,(double *)in_stack_fffffffffffdbf48);
        std::
        vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        ::operator[](avStack_19798,0);
        Eigen::Matrix<double,3,3,0,3,3>::operator=
                  ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                    *)in_stack_fffffffffffdbf00);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0> *)
                   in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcde6a2);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  (in_stack_fffffffffffdbf50,(double *)in_stack_fffffffffffdbf48);
        std::
        vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        ::operator[](avStack_19798,1);
        Eigen::Matrix<double,3,3,0,3,3>::operator=
                  ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                    *)in_stack_fffffffffffdbf00);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0> *)
                   in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcde709);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  (in_stack_fffffffffffdbf50,(double *)in_stack_fffffffffffdbf48);
        std::
        vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        ::operator[](avStack_19798,2);
        Eigen::Matrix<double,3,3,0,3,3>::operator=
                  ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                    *)in_stack_fffffffffffdbf00);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0> *)
                   in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcde76f);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  (in_stack_fffffffffffdbf50,(double *)in_stack_fffffffffffdbf48);
        std::
        vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        ::operator[](&vStack_197c0,0);
        Eigen::Matrix<double,3,3,0,3,3>::operator=
                  ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                    *)in_stack_fffffffffffdbf00);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0> *)
                   in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcde7d5);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  (in_stack_fffffffffffdbf50,(double *)in_stack_fffffffffffdbf48);
        std::
        vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        ::operator[](&vStack_197c0,1);
        Eigen::Matrix<double,3,3,0,3,3>::operator=
                  ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                    *)in_stack_fffffffffffdbf00);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_0> *)
                   in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcde83c);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  (in_stack_fffffffffffdbf50,(double *)in_stack_fffffffffffdbf48);
        std::
        vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        ::operator[](&vStack_197c0,2);
        Eigen::Matrix<double,3,3,0,3,3>::operator=
                  ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                    *)in_stack_fffffffffffdbf00);
        fivept_kneip::initEpncpRowR(in_stack_fffffffffffdf9a0,in_stack_fffffffffffdf998);
        iStack_197c4 = iStack_197c4 + 1;
        Eigen::DenseBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>::row
                  ((DenseBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_> *)
                   in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,66,197,0,66,197>,1,197,false>::operator=
                  ((Block<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1,_197,_false> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_> *)in_stack_fffffffffffdbf00
                  );
      }
    }
  }
  fivept_kneip::initMatrix((Matrix<double,_66,_197,_0,_66,_197> *)0xcde97d);
  fivept_kneip::computeBasis
            ((Matrix<double,_66,_197,_0,_66,_197> *)
             groebnerMatrix.super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>.
             m_storage.m_data.array[0x1017]);
  Eigen::DenseBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>::Zero();
  Eigen::Matrix<double,20,20,0,20,20>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,20,20,0,20,20>>>
            ((Matrix<double,_20,_20,_0,_20,_20> *)in_stack_fffffffffffdbf08,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_20,_20,_0,_20,_20>_>_>
              *)in_stack_fffffffffffdbf00);
  Eigen::DenseBase<Eigen::Matrix<double,66,197,0,66,197>>::block<10,20>
            ((DenseBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_> *)in_stack_fffffffffffdbf18,
             (Index)in_stack_fffffffffffdbf10,(Index)in_stack_fffffffffffdbf08);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_10,_20,_false>_>::
  operator-(in_stack_fffffffffffdbf20);
  Eigen::DenseBase<Eigen::Matrix<double,20,20,0,20,20>>::block<10,20>
            ((DenseBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> *)in_stack_fffffffffffdbf18,
             (Index)in_stack_fffffffffffdbf10,(Index)in_stack_fffffffffffdbf08);
  Eigen::Block<Eigen::Matrix<double,20,20,0,20,20>,10,20,false>::operator=
            ((Block<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_10,_20,_false> *)
             in_stack_fffffffffffdbf08,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_10,_20,_false>_>_>
              *)in_stack_fffffffffffdbf00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1> *)
                      in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdea38);
  *pSVar5 = 1.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1> *)
                      in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdea6e);
  *pSVar5 = 1.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1> *)
                      in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdeaa4);
  *pSVar5 = 1.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1> *)
                      in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdeada);
  *pSVar5 = 1.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1> *)
                      in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdeb10);
  *pSVar5 = 1.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1> *)
                      in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdeb46);
  *pSVar5 = 1.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1> *)
                      in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdeb7c);
  *pSVar5 = 1.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1> *)
                      in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdebb2);
  *pSVar5 = 1.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1> *)
                      in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdebe8);
  *pSVar5 = 1.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_1> *)
                      in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdec1e);
  *pSVar5 = 1.0;
  Eigen::EigenSolver<Eigen::Matrix<double,20,20,0,20,20>>::
  EigenSolver<Eigen::Matrix<double,20,20,0,20,20>>
            (in_stack_fffffffffffdbf68,in_stack_fffffffffffdbf60,(bool)computeEigenvectors);
  Eigen::EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>::eigenvalues(&EStack_1f180);
  Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>::Matrix
            ((Matrix<std::complex<double>,_20,_1,_0,_20,_1> *)in_stack_fffffffffffdbf08,
             (Matrix<std::complex<double>,_20,_1,_0,_20,_1> *)in_stack_fffffffffffdbf00);
  Eigen::EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>::eigenvectors
            (in_stack_fffffffffffdc0a0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffdbf08,in_stack_fffffffffffdbf00);
  uStack_20c1c = 0;
  do {
    if (0x13 < uStack_20c1c) {
      std::
      vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)in_stack_fffffffffffdbf18);
      std::
      vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)in_stack_fffffffffffdbf18);
      return;
    }
    std::complex<double>::complex((complex<double> *)&dStack_20c30,0.0,0.0);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>,_1>::
             operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>,_1> *)
                        in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00);
    dStack_20c30 = *(double *)pSVar6->_M_value;
    dStack_20c28 = *(double *)(pSVar6->_M_value + 8);
    auVar13._0_8_ = std::complex<double>::imag_abi_cxx11_((complex<double> *)&dStack_20c30);
    auVar13._8_8_ = 0;
    auVar46._8_8_ = 0x7fffffffffffffff;
    auVar46._0_8_ = 0x7fffffffffffffff;
    auVar13 = vpand_avx(auVar13,auVar46);
    dVar9 = auVar13._0_8_;
    uVar8 = 0x3fb999999999999a;
    if (dVar9 < 0.1) {
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcded84);
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdeda9);
      std::operator/((complex<double> *)in_stack_fffffffffffdbf00,(complex<double> *)0xcdedc8);
      uStack_20c40 = uVar8;
      dStack_20c38 = dVar9;
      dStack_20c30 = (double)uVar8;
      dStack_20c28 = dVar9;
      dVar9 = std::complex<double>::real_abi_cxx11_((complex<double> *)&dStack_20c30);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdee3e);
      *pSVar7 = dVar9;
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdee78);
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdee9d);
      std::operator/((complex<double> *)in_stack_fffffffffffdbf00,(complex<double> *)0xcdeebc);
      dStack_20c50 = dVar9;
      uStack_20c48 = uVar8;
      dStack_20c30 = dVar9;
      dStack_20c28 = (double)uVar8;
      dVar10 = std::complex<double>::real_abi_cxx11_((complex<double> *)&dStack_20c30);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdef34);
      *pSVar7 = dVar10;
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdef6e);
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdef93);
      std::operator/((complex<double> *)in_stack_fffffffffffdbf00,(complex<double> *)0xcdefb2);
      dStack_20c60 = dVar10;
      dStack_20c58 = dVar9;
      dStack_20c30 = dVar10;
      dStack_20c28 = dVar9;
      dVar9 = std::complex<double>::real_abi_cxx11_((complex<double> *)&dStack_20c30);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf02a);
      *pSVar7 = dVar9;
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf064);
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf089);
      std::operator/((complex<double> *)in_stack_fffffffffffdbf00,(complex<double> *)0xcdf0a8);
      dStack_20c70 = dVar9;
      dStack_20c68 = dVar10;
      dStack_20c30 = dVar9;
      dStack_20c28 = dVar10;
      dVar10 = std::complex<double>::real_abi_cxx11_((complex<double> *)&dStack_20c30);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf120);
      *pSVar7 = dVar10;
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf15a);
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf17f);
      std::operator/((complex<double> *)in_stack_fffffffffffdbf00,(complex<double> *)0xcdf19e);
      dStack_20c80 = dVar10;
      dStack_20c78 = dVar9;
      dStack_20c30 = dVar10;
      dStack_20c28 = dVar9;
      dVar9 = std::complex<double>::real_abi_cxx11_((complex<double> *)&dStack_20c30);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf215);
      *pSVar7 = dVar9;
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf24f);
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf274);
      std::operator/((complex<double> *)in_stack_fffffffffffdbf00,(complex<double> *)0xcdf293);
      dStack_20c90 = dVar9;
      dStack_20c88 = dVar10;
      dStack_20c30 = dVar9;
      dStack_20c28 = dVar10;
      dVar10 = std::complex<double>::real_abi_cxx11_((complex<double> *)&dStack_20c30);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf30c);
      *pSVar7 = dVar10;
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf346);
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf36b);
      std::operator/((complex<double> *)in_stack_fffffffffffdbf00,(complex<double> *)0xcdf38a);
      dStack_20ca0 = dVar10;
      dStack_20c98 = dVar9;
      dStack_20c30 = dVar10;
      dStack_20c28 = dVar9;
      dVar9 = std::complex<double>::real_abi_cxx11_((complex<double> *)&dStack_20c30);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf402);
      *pSVar7 = dVar9;
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf43c);
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf461);
      std::operator/((complex<double> *)in_stack_fffffffffffdbf00,(complex<double> *)0xcdf480);
      dStack_20cb0 = dVar9;
      dStack_20ca8 = dVar10;
      dStack_20c30 = dVar9;
      dStack_20c28 = dVar10;
      dVar10 = std::complex<double>::real_abi_cxx11_((complex<double> *)&dStack_20c30);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf4f9);
      *pSVar7 = dVar10;
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf533);
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_20,_20,_0,_20,_20>,_1> *)
                 in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf558);
      std::operator/((complex<double> *)in_stack_fffffffffffdbf00,(complex<double> *)0xcdf577);
      dStack_20cc0 = dVar10;
      dStack_20cb8 = dVar9;
      dStack_20c30 = dVar10;
      dStack_20c28 = dVar9;
      dVar9 = std::complex<double>::real_abi_cxx11_((complex<double> *)&dStack_20c30);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xcdf5ee);
      *pSVar7 = dVar9;
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                 (Index)in_stack_fffffffffffdbf10);
      RStack_20cc8 = Eigen::
                     MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::
                     norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>
                           *)in_stack_fffffffffffdbf00);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                 (Index)in_stack_fffffffffffdbf10);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator/
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
                 in_stack_fffffffffffdbf50,(double *)in_stack_fffffffffffdbf48);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                 (Index)in_stack_fffffffffffdbf10);
      Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
                 in_stack_fffffffffffdbf08,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                  *)in_stack_fffffffffffdbf00);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                 (Index)in_stack_fffffffffffdbf10);
      RStack_20cc8 = Eigen::
                     MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::
                     norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>
                           *)in_stack_fffffffffffdbf00);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                 (Index)in_stack_fffffffffffdbf10);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator/
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
                 in_stack_fffffffffffdbf50,(double *)in_stack_fffffffffffdbf48);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                 (Index)in_stack_fffffffffffdbf10);
      Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
                 in_stack_fffffffffffdbf08,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                  *)in_stack_fffffffffffdbf00);
      SVar11 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                         ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xcdf782);
      auVar47._8_8_ = 0x7fffffffffffffff;
      auVar47._0_8_ = 0x7fffffffffffffff;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = SVar11 - 1.0;
      auVar13 = vpand_avx(auVar14,auVar47);
      if (auVar13._0_8_ < 0.1) {
        Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xcdf7ce);
        dStack_20ec8 = 0.0;
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        auVar15._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xcdf9e1);
        auVar15._8_8_ = 0;
        auVar48._8_8_ = 0x7fffffffffffffff;
        auVar48._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar15,auVar48);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        auVar16._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xcdfc1d);
        auVar16._8_8_ = 0;
        auVar49._8_8_ = 0x7fffffffffffffff;
        auVar49._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar16,auVar49);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        auVar17._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xcdfe59);
        auVar17._8_8_ = 0;
        auVar50._8_8_ = 0x7fffffffffffffff;
        auVar50._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar17,auVar50);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        auVar18._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xce0095);
        auVar18._8_8_ = 0;
        auVar51._8_8_ = 0x7fffffffffffffff;
        auVar51._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar18,auVar51);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        auVar19._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xce02d1);
        auVar19._8_8_ = 0;
        auVar52._8_8_ = 0x7fffffffffffffff;
        auVar52._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar19,auVar52);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        auVar20._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xce050d);
        auVar20._8_8_ = 0;
        auVar53._8_8_ = 0x7fffffffffffffff;
        auVar53._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar20,auVar53);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        auVar21._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xce074b);
        auVar21._8_8_ = 0;
        auVar54._8_8_ = 0x7fffffffffffffff;
        auVar54._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar21,auVar54);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        auVar22._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xce0989);
        auVar22._8_8_ = 0;
        auVar55._8_8_ = 0x7fffffffffffffff;
        auVar55._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar22,auVar55);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        auVar23._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xce0bc7);
        auVar23._8_8_ = 0;
        auVar56._8_8_ = 0x7fffffffffffffff;
        auVar56._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar23,auVar56);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                  (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                    *)in_stack_fffffffffffdbf10);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                   (Index)in_stack_fffffffffffdbf10);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                   in_stack_fffffffffffdbf08,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
        auVar24._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xce0e05);
        auVar24._8_8_ = 0;
        auVar57._8_8_ = 0x7fffffffffffffff;
        auVar57._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar24,auVar57);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce0e50);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce0e83);
        SVar2 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce0eb8);
        dVar9 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce0eed);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = SVar1;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = SVar2;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = dVar9 * *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar25,auVar58,auVar82);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce0f46);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce0f7b);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = SVar1;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = auVar13._0_8_;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar26,auVar59,auVar83);
        auVar60._8_8_ = 0x7fffffffffffffff;
        auVar60._0_8_ = 0x7fffffffffffffff;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = auVar13._0_8_ + -1.0;
        auVar13 = vpand_avx(auVar27,auVar60);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce0feb);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1020);
        SVar2 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1055);
        dVar9 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1089);
        auVar61._8_8_ = 0;
        auVar61._0_8_ = SVar1;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = SVar2;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = dVar9 * *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar28,auVar61,auVar84);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce10e2);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1118);
        auVar62._8_8_ = 0;
        auVar62._0_8_ = SVar1;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = auVar13._0_8_;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar29,auVar62,auVar85);
        auVar63._8_8_ = 0x7fffffffffffffff;
        auVar63._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar13,auVar63);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce117c);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce11b1);
        SVar2 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce11e6);
        dVar9 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce121c);
        auVar64._8_8_ = 0;
        auVar64._0_8_ = SVar1;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = SVar2;
        auVar86._8_8_ = 0;
        auVar86._0_8_ = dVar9 * *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar30,auVar64,auVar86);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1275);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce12a9);
        auVar65._8_8_ = 0;
        auVar65._0_8_ = SVar1;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = auVar13._0_8_;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar31,auVar65,auVar87);
        auVar66._8_8_ = 0x7fffffffffffffff;
        auVar66._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar13,auVar66);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce130f);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1344);
        SVar2 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1378);
        dVar9 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce13ac);
        auVar67._8_8_ = 0;
        auVar67._0_8_ = SVar1;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = SVar2;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = dVar9 * *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar32,auVar67,auVar88);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1406);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce143c);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = SVar1;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = auVar13._0_8_;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar33,auVar68,auVar89);
        auVar69._8_8_ = 0x7fffffffffffffff;
        auVar69._0_8_ = 0x7fffffffffffffff;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = auVar13._0_8_ + -1.0;
        auVar13 = vpand_avx(auVar34,auVar69);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce14ae);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce14e3);
        SVar2 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1517);
        dVar9 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce154d);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = SVar1;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = SVar2;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = dVar9 * *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar35,auVar70,auVar90);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce15a7);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce15db);
        auVar71._8_8_ = 0;
        auVar71._0_8_ = SVar1;
        auVar91._8_8_ = 0;
        auVar91._0_8_ = auVar13._0_8_;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar36,auVar71,auVar91);
        auVar72._8_8_ = 0x7fffffffffffffff;
        auVar72._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpand_avx(auVar13,auVar72);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1641);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1676);
        SVar2 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce16ac);
        SVar97 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce16e2);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = SVar1;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = SVar2;
        auVar92._8_8_ = 0;
        auVar92._0_8_ = SVar97 * *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar37,auVar73,auVar92);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce173a);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce176e);
        auVar74._8_8_ = 0;
        auVar74._0_8_ = SVar1;
        auVar93._8_8_ = 0;
        auVar93._0_8_ = auVar13._0_8_;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *pSVar7;
        auVar13 = vfmadd213sd_fma(auVar38,auVar74,auVar93);
        auVar75._8_8_ = 0x7fffffffffffffff;
        auVar75._0_8_ = 0x7fffffffffffffff;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = auVar13._0_8_ + -1.0;
        auVar13 = vpand_avx(auVar39,auVar75);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce17e0);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1816);
        SVar2 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce184b);
        dVar9 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce187f);
        auVar76._8_8_ = 0;
        auVar76._0_8_ = SVar1;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = SVar2;
        auVar94._8_8_ = 0;
        auVar94._0_8_ = dVar9 * *pSVar7;
        auVar13 = vfmsub213sd_fma(auVar40,auVar76,auVar94);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce18d8);
        auVar77._8_8_ = 0x7fffffffffffffff;
        auVar77._0_8_ = 0x7fffffffffffffff;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = auVar13._0_8_ - *pSVar7;
        auVar13 = vpand_avx(auVar41,auVar77);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1934);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1969);
        SVar2 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce199c);
        dVar9 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce19d2);
        auVar78._8_8_ = 0;
        auVar78._0_8_ = SVar1;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = SVar2;
        auVar95._8_8_ = 0;
        auVar95._0_8_ = dVar9 * *pSVar7;
        auVar13 = vfmsub213sd_fma(auVar42,auVar78,auVar95);
        this_01 = auVar13._0_8_;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1a2c);
        auVar79._8_8_ = 0x7fffffffffffffff;
        auVar79._0_8_ = 0x7fffffffffffffff;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = (double)this_01 - *pSVar7;
        auVar13 = vpand_avx(auVar43,auVar79);
        dStack_20ec8 = dStack_20ec8 + auVar13._0_8_;
        other = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1a86);
        SVar1 = *(Scalar *)other;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                            in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1aba);
        in_stack_fffffffffffdbfc8 =
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
              *)*pSVar7;
        in_stack_fffffffffffdbfd0 =
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                        in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1aef);
        other_01 = *(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                     **)in_stack_fffffffffffdbfd0;
        this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1b24);
        auVar80._8_8_ = 0;
        auVar80._0_8_ = SVar1;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = in_stack_fffffffffffdbfc8;
        auVar96._8_8_ = 0;
        auVar96._0_8_ = (double)other_01 * *(double *)this;
        auVar13 = vfmsub213sd_fma(auVar44,auVar80,auVar96);
        other_00 = auVar13._0_8_;
        this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                             in_stack_fffffffffffdbf08,(Index)in_stack_fffffffffffdbf00,0xce1b7c);
        auVar81._8_8_ = 0x7fffffffffffffff;
        auVar81._0_8_ = 0x7fffffffffffffff;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = (double)other_00 - *(double *)this_00;
        auVar13 = vpand_avx(auVar45,auVar81);
        dStack_20ec8 = auVar13._0_8_ + dStack_20ec8;
        if (dStack_20ec8 < 0.001) {
          Eigen::Matrix<double,_3,_5,_0,_3,_5>::Matrix((Matrix<double,_3,_5,_0,_3,_5> *)0xce1bde);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                      *)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
          cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                    (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>::operator=
                    ((Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> *)
                     in_stack_fffffffffffdbf08,
                     (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                      *)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
          cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                    (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>::operator=
                    ((Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> *)
                     in_stack_fffffffffffdbf08,
                     (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                      *)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
          cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                    (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>::operator=
                    ((Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> *)
                     in_stack_fffffffffffdbf08,
                     (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                      *)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
          cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                    (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>::operator=
                    ((Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> *)
                     in_stack_fffffffffffdbf08,
                     (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffdbf18,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                      *)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
          cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                    (in_stack_fffffffffffdbfd0,in_stack_fffffffffffdbfc8);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>::operator=
                    ((Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> *)
                     in_stack_fffffffffffdbf08,
                     (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffdbf00);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>(this_01,other);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>(this_01,other);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>(this_01,other);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>(this_01,other);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>(this_01,other);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>(this_01,other);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>(this_01,other);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>(this_01,other);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>(this_01,other);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                    (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>(this_01,other);
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xce2299);
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xce22a8);
          bVar4 = true;
          for (iStack_232c8 = 0; iStack_232c8 < 5; iStack_232c8 = iStack_232c8 + 1) {
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>(this,other_01);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffdbf18,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (this_00,other_00);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                     dot<Eigen::Matrix<double,3,1,0,3,1>>
                               ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf08,
                                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf00);
            if (RVar12 < 0.0) {
              bVar4 = false;
              break;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>(this,other_01);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffdbf18,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (this_00,other_00);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                     dot<Eigen::Matrix<double,3,1,0,3,1>>
                               ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf08,
                                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf00);
            if (RVar12 < 0.0) {
              bVar4 = false;
              break;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>(this,other_01);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffdbf18,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (this_00,other_00);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                     dot<Eigen::Matrix<double,3,1,0,3,1>>
                               ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf08,
                                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf00);
            if (RVar12 < 0.0) {
              bVar4 = false;
              break;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>(this,other_01);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffdbf18,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (this_00,other_00);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                     dot<Eigen::Matrix<double,3,1,0,3,1>>
                               ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf08,
                                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf00);
            if (RVar12 < 0.0) {
              bVar4 = false;
              break;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>(this,other_01);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffdbf18,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (this_00,other_00);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                     dot<Eigen::Matrix<double,3,1,0,3,1>>
                               ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf08,
                                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf00);
            if (RVar12 < 0.0) {
              bVar4 = false;
              break;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>(this,other_01);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffdbf18,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (this_00,other_00);
            in_stack_fffffffffffdbf48 = aDStack_232c0;
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            in_stack_fffffffffffdbf50 =
                 (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                 dot<Eigen::Matrix<double,3,1,0,3,1>>
                           ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_fffffffffffdbf08,
                            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_fffffffffffdbf00);
            if ((double)in_stack_fffffffffffdbf50 < 0.0) {
              bVar4 = false;
              break;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>(this,other_01);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffdbf18,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (this_00,other_00);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                     dot<Eigen::Matrix<double,3,1,0,3,1>>
                               ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf08,
                                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf00);
            if (RVar12 < 0.0) {
              bVar4 = false;
              break;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>(this,other_01);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffdbf18,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (this_00,other_00);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                     dot<Eigen::Matrix<double,3,1,0,3,1>>
                               ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf08,
                                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf00);
            if (RVar12 < 0.0) {
              bVar4 = false;
              break;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>(this,other_01);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffdbf18,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (this_00,other_00);
            in_stack_fffffffffffdbf18 = aDStack_232c0;
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                     dot<Eigen::Matrix<double,3,1,0,3,1>>
                               ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf08,
                                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                in_stack_fffffffffffdbf00);
            if (RVar12 < 0.0) {
              bVar4 = false;
              break;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>(this,other_01);
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
                      (in_stack_fffffffffffdbf18,(Index)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffdbf18,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)in_stack_fffffffffffdbf10);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (this_00,other_00);
            in_stack_fffffffffffdbf08 = aDStack_232c0;
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                      ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf08,
                       (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffdbf00);
            in_stack_fffffffffffdbf10 =
                 (MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>_>
                  *)Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                    dot<Eigen::Matrix<double,3,1,0,3,1>>
                              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                               in_stack_fffffffffffdbf08,
                               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                               in_stack_fffffffffffdbf00);
            if ((double)in_stack_fffffffffffdbf10 < 0.0) {
              bVar4 = false;
              break;
            }
          }
          if (bVar4) {
            std::
            vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                         *)in_stack_fffffffffffdbf18,(value_type *)in_stack_fffffffffffdbf10);
          }
        }
      }
    }
    uStack_20c1c = uStack_20c1c + 1;
  } while( true );
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip_main(
    const Eigen::Matrix<double,3,5> & f1,
    const Eigen::Matrix<double,3,5> & f2,
    rotations_t & rotations )
{
  Eigen::Matrix<double,66,197> groebnerMatrix =
      Eigen::Matrix<double,66,197>::Zero();
  Eigen::Matrix3d temp1 = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d temp2 = Eigen::Matrix3d::Zero();
  std::vector<Eigen::Matrix3d, Eigen::aligned_allocator<Eigen::Matrix3d> > c_1;
  c_1.push_back(temp1);
  c_1.push_back(temp1);
  c_1.push_back(temp1);
  std::vector<Eigen::Matrix3d, Eigen::aligned_allocator<Eigen::Matrix3d> > c_2;
  c_2.push_back(temp2);
  c_2.push_back(temp2);
  c_2.push_back(temp2);

  int currentRow = 0;

  for( int firstFeat = 0; firstFeat < 5; firstFeat++ )
  {
    for( int secondFeat = firstFeat + 1; secondFeat < 5; secondFeat++ )
    {
      temp1 = f1.col(firstFeat)*f1.col(secondFeat).transpose();
      temp2 = f2.col(firstFeat)*f2.col(secondFeat).transpose();

      for( int thirdFeat = secondFeat + 1; thirdFeat < 5; thirdFeat++ )
      {
        c_1[0] = temp1 * f1(0,thirdFeat);
        c_1[1] = temp1 * f1(1,thirdFeat);
        c_1[2] = temp1 * f1(2,thirdFeat);
        c_2[0] = temp2 * f2(0,thirdFeat);
        c_2[1] = temp2 * f2(1,thirdFeat);
        c_2[2] = temp2 * f2(2,thirdFeat);

        groebnerMatrix.row(currentRow++) =
            fivept_kneip::initEpncpRowR( c_1, c_2 );
      }
    }
  }

  fivept_kneip::initMatrix(groebnerMatrix);
  fivept_kneip::computeBasis(groebnerMatrix);

  Eigen::Matrix<double,20,20> M = Eigen::Matrix<double,20,20>::Zero();
  M.block<10,20>(0,0) = -groebnerMatrix.block<10,20>(51,177);
  M(10,1) = 1.0;
  M(11,2) = 1.0;
  M(12,3) = 1.0;
  M(13,4) = 1.0;
  M(14,5) = 1.0;
  M(15,6) = 1.0;
  M(16,7) = 1.0;
  M(17,8) = 1.0;
  M(18,9) = 1.0;
  M(19,18) = 1.0;

  Eigen::EigenSolver< Eigen::Matrix<double,20,20> > Eig(M,true);
  Eigen::Matrix<std::complex<double>,20,1> D = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,20,20> V = Eig.eigenvectors();

  //Eigen::Matrix<std::complex<double>,9,1> tempVector;
  rotation_t finalRotation = Eigen::Matrix3d::Zero();
  for( unsigned int i = 0; i < 20; i++ )
  {
    std::complex<double> tempp;
    tempp = D[i];

    //check if we have a real solution
    if( fabs(tempp.imag()) < 0.1 )
    {
      tempp = V(18,i)/V(19,i);
      finalRotation(0,0) = tempp.real();// tempVector[0] = tempp;
      tempp = V(17,i)/V(19,i);
      finalRotation(0,1) = tempp.real();// tempVector[1] = tempp;
      tempp = V(16,i)/V(19,i);
      finalRotation(0,2) = tempp.real();// tempVector[2] = tempp;
      tempp = V(15,i)/V(19,i);
      finalRotation(1,0) = tempp.real();// tempVector[3] = tempp;
      tempp = V(14,i)/V(19,i);
      finalRotation(1,1) = tempp.real();// tempVector[4] = tempp;
      tempp = V(13,i)/V(19,i);
      finalRotation(1,2) = tempp.real();// tempVector[5] = tempp;
      tempp = V(12,i)/V(19,i);
      finalRotation(2,0) = tempp.real();// tempVector[6] = tempp;
      tempp = V(11,i)/V(19,i);
      finalRotation(2,1) = tempp.real();// tempVector[7] = tempp;
      tempp = V(10,i)/V(19,i);
      finalRotation(2,2) = tempp.real();// tempVector[8] = tempp;

      double tempNorm = finalRotation.row(1).norm();
      finalRotation.row(1) = finalRotation.row(1) / tempNorm;
      tempNorm = finalRotation.row(2).norm();
      finalRotation.row(2) = finalRotation.row(2) / tempNorm;

      //check if the normalized rotation matrix has determinant close enough to 1
      if( fabs( finalRotation.determinant() - 1.0 ) < 0.1 )
      {
        Eigen::Matrix3d eval;
        double totalEval = 0.0;
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(2).cross(finalRotation*f2.col(2));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(0,0)+
            finalRotation(0,1)*finalRotation(0,1)+
            finalRotation(0,2)*finalRotation(0,2)-1);
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(1,0)+
            finalRotation(0,1)*finalRotation(1,1)+
            finalRotation(0,2)*finalRotation(1,2));
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(2,0)+
            finalRotation(0,1)*finalRotation(2,1)+
            finalRotation(0,2)*finalRotation(2,2));
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(1,0)+
            finalRotation(1,1)*finalRotation(1,1)+
            finalRotation(1,2)*finalRotation(1,2)-1);
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(2,0)+
            finalRotation(1,1)*finalRotation(2,1)+
            finalRotation(1,2)*finalRotation(2,2));
        totalEval += fabs(
            finalRotation(2,0)*finalRotation(2,0)+
            finalRotation(2,1)*finalRotation(2,1)+
            finalRotation(2,2)*finalRotation(2,2)-1);
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(2,1)-
            finalRotation(2,0)*finalRotation(1,1)-finalRotation(0,2));
        totalEval += fabs(
            finalRotation(2,0)*finalRotation(0,1)-
            finalRotation(0,0)*finalRotation(2,1)-finalRotation(1,2));
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(1,1)-
            finalRotation(1,0)*finalRotation(0,1)-finalRotation(2,2));

        //check if the initial constraints are fullfilled to a sufficient extend
        if( totalEval < 0.001 )
        {
          Eigen::Matrix<double,3,5> normalVectors;
          normalVectors.col(0) = f1.col(0).cross(finalRotation * f2.col(0));
          normalVectors.col(1) = f1.col(1).cross(finalRotation * f2.col(1));
          normalVectors.col(2) = f1.col(2).cross(finalRotation * f2.col(2));
          normalVectors.col(3) = f1.col(3).cross(finalRotation * f2.col(3));
          normalVectors.col(4) = f1.col(4).cross(finalRotation * f2.col(4));

          Eigen::Vector3d trans01 =
              normalVectors.col(0).cross(normalVectors.col(1));
          Eigen::Vector3d trans02 =
              normalVectors.col(0).cross(normalVectors.col(2));
          Eigen::Vector3d trans03 =
              normalVectors.col(0).cross(normalVectors.col(3));
          Eigen::Vector3d trans04 =
              normalVectors.col(0).cross(normalVectors.col(4));
          Eigen::Vector3d trans12 =
              normalVectors.col(1).cross(normalVectors.col(2));
          Eigen::Vector3d trans13 =
              normalVectors.col(1).cross(normalVectors.col(3));
          Eigen::Vector3d trans14 =
              normalVectors.col(1).cross(normalVectors.col(4));
          Eigen::Vector3d trans23 =
              normalVectors.col(2).cross(normalVectors.col(3));
          Eigen::Vector3d trans24 =
              normalVectors.col(2).cross(normalVectors.col(4));
          Eigen::Vector3d trans34 =
              normalVectors.col(3).cross(normalVectors.col(4));

          Eigen::Vector3d tempVector1;
          Eigen::Vector3d tempVector2;

          bool positive = true;

          for( int i = 0; i < 5; i++ )
          {
            tempVector1 = trans01.cross( f1.col(i) );
            tempVector2 = trans01.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans02.cross( f1.col(i) );
            tempVector2 = trans02.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans03.cross( f1.col(i) );
            tempVector2 = trans03.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans04.cross( f1.col(i) );
            tempVector2 = trans04.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans12.cross( f1.col(i) );
            tempVector2 = trans12.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans13.cross( f1.col(i) );
            tempVector2 = trans13.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans14.cross( f1.col(i) );
            tempVector2 = trans14.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans23.cross( f1.col(i) );
            tempVector2 = trans23.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans24.cross( f1.col(i) );
            tempVector2 = trans24.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans34.cross( f1.col(i) );
            tempVector2 = trans34.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
          }

          //finally, check if the cheiriality constraint is fullfilled to
          //sufficient extend
          if( positive )
            rotations.push_back(finalRotation);
        }
      }
    }
  }
}